

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_section.hpp
# Opt level: O0

void pstore::repo::bss_section_creation_dispatcher::validate
               (not_null<const_pstore::repo::section_content_*> sec)

{
  bool bVar1;
  uint uVar2;
  section_content *psVar3;
  size_t sVar4;
  not_null<const_pstore::repo::section_content_*> local_10;
  not_null<const_pstore::repo::section_content_*> sec_local;
  
  local_10.ptr_ = sec.ptr_;
  psVar3 = gsl::not_null<const_pstore::repo::section_content_*>::operator->(&local_10);
  bVar1 = std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
          empty(&psVar3->ifixups);
  if (bVar1) {
    psVar3 = gsl::not_null<const_pstore::repo::section_content_*>::operator->(&local_10);
    bVar1 = std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
            ::empty(&psVar3->xfixups);
    if (bVar1) {
      psVar3 = gsl::not_null<const_pstore::repo::section_content_*>::operator->(&local_10);
      sVar4 = small_vector<unsigned_char,_128UL>::size(&psVar3->data);
      uVar2 = std::numeric_limits<unsigned_int>::max();
      if (sVar4 <= uVar2) {
        return;
      }
      raise<pstore::repo::error_code>(bss_section_too_large);
    }
  }
  assert_failed("sec->ifixups.empty () && sec->xfixups.empty ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/bss_section.hpp"
                ,0x87);
}

Assistant:

static void validate (gsl::not_null<section_content const *> const sec) {
                PSTORE_ASSERT (sec->ifixups.empty () && sec->xfixups.empty ());
                if (sec->data.size () > std::numeric_limits<bss_section::size_type>::max ()) {
                    raise (error_code::bss_section_too_large);
                }
            }